

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

void __thiscall
AlignmentRecord::getMergedDnaSequence
          (AlignmentRecord *this,BamAlignment *alignment,string *mainReference)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  string *psVar4;
  reference pcVar5;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>,_vector<int,_allocator<int>_>_>_>
  *p_Var6;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_vector<int,_allocator<int>_>_>_>
  *p_Var7;
  size_t sVar8;
  ShortDnaSequence *in_RDX;
  long in_RSI;
  AlignmentRecord *in_RDI;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref;
  char i;
  iterator __end1_1;
  iterator __begin1_1;
  string *__range1_1;
  int c_pos2;
  int c_pos1;
  int q_pos2;
  int q_pos1;
  int ref_e_pos2;
  int ref_s_pos2;
  int ref_e_pos1;
  int ref_s_pos1;
  int offset_b2;
  int offset_b1;
  int offset_f2;
  int offset_f1;
  uint s;
  CigarOp *it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *__range1;
  vector<char,_std::allocator<char>_> cigar_temp_unrolled;
  string nucigar;
  string qualities;
  string dna;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_fffffffffffffbf8;
  ShortDnaSequence *in_stack_fffffffffffffc00;
  string *in_stack_fffffffffffffc08;
  string *in_stack_fffffffffffffc10;
  string *in_stack_fffffffffffffc18;
  AlignmentRecord *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  AlignmentRecord *in_stack_fffffffffffffc30;
  int *in_stack_fffffffffffffc38;
  int *in_stack_fffffffffffffc40;
  string *this_00;
  string *in_stack_fffffffffffffc48;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  int *in_stack_fffffffffffffc60;
  AlignmentRecord *this_01;
  allocator *this_02;
  string *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  ShortDnaSequence *in_stack_fffffffffffffcf0;
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288;
  string local_268 [32];
  string local_248 [104];
  string local_1e0 [151];
  char local_149;
  undefined8 local_148;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  undefined1 *local_138;
  uint local_114;
  uint local_110;
  undefined1 local_10c [8];
  undefined1 local_104 [8];
  int local_fc;
  undefined1 local_f8 [8];
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_e0;
  CigarOp *local_d0;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  local_c8;
  long local_c0;
  undefined1 local_99 [17];
  undefined8 in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  AlignmentRecord *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [32];
  ShortDnaSequence *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  this_02 = (allocator *)&stack0xffffffffffffff8f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff90,"",this_02);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  this_01 = (AlignmentRecord *)local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_99 + 1),"",(allocator *)this_01);
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x29152c);
  local_c0 = local_10 + 0xb8;
  local_c8._M_current =
       (CigarOp *)
       std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::begin
                 (in_stack_fffffffffffffbf8);
  local_d0 = (CigarOp *)
             std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::end
                       (in_stack_fffffffffffffbf8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                             *)in_stack_fffffffffffffc00,
                            (__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                             *)in_stack_fffffffffffffbf8), bVar1) {
    local_e0._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
         ::operator*(&local_c8);
    for (local_e0._M_allocated_capacity._4_4_ = 0;
        (uint)local_e0._M_allocated_capacity._4_4_ < *(uint32_t *)(local_e0._8_8_ + 4);
        local_e0._M_allocated_capacity._4_4_ = local_e0._M_allocated_capacity._4_4_ + 1) {
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc10,
                 (value_type *)in_stack_fffffffffffffc08);
    }
    __gnu_cxx::
    __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
    ::operator++(&local_c8);
  }
  local_e0._M_allocated_capacity._0_4_ =
       computeOffset((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc20);
  local_f0._12_4_ = computeOffset((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc20);
  local_f0._8_4_ = computeRevOffset(in_stack_fffffffffffffc50);
  local_f0._4_4_ = computeRevOffset(in_stack_fffffffffffffc50);
  local_f0._0_4_ = in_RDI->start1 - local_e0._0_4_;
  local_f8._4_4_ = in_RDI->end1 + local_f0._8_4_;
  local_f8._0_4_ = (*(int *)(local_10 + 0xac) - local_f0._12_4_) + 1;
  local_fc = BamTools::BamAlignment::GetEndPosition(SUB81(local_10,0),false);
  local_fc = local_fc + local_f0._4_4_;
  local_104._4_4_ = 0;
  local_104._0_4_ = 0;
  local_10c._4_4_ = 0;
  local_10c._0_4_ = 0;
  if (((int)local_f8._0_4_ < (int)local_f0._0_4_) || (local_fc < (int)local_f8._4_4_)) {
    if (((int)local_f8._0_4_ < (int)local_f0._0_4_) || ((int)local_f8._4_4_ < local_fc)) {
      if (((int)local_f0._0_4_ < (int)local_f8._0_4_) || (local_fc < (int)local_f8._4_4_)) {
        while ((int)local_f8._0_4_ < (int)local_f0._0_4_) {
          in_stack_fffffffffffffc08 = (string *)local_f8;
          in_stack_fffffffffffffc00 = (ShortDnaSequence *)local_104;
          in_stack_fffffffffffffbf8 =
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_10c;
          noOverlapMerge(in_stack_fffffffffffffc20,(BamAlignment *)in_stack_fffffffffffffc18,
                         in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                         (string *)in_stack_fffffffffffffc00,
                         (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffbf8,
                         (int *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc38,
                         in_stack_fffffffffffffc40);
        }
        while ((int)local_f8._0_4_ <= local_fc) {
          in_stack_fffffffffffffc18 = (string *)local_f8;
          in_stack_fffffffffffffc10 = (string *)local_104;
          in_stack_fffffffffffffc08 = (string *)(local_104 + 4);
          in_stack_fffffffffffffc00 = (ShortDnaSequence *)local_10c;
          in_stack_fffffffffffffbf8 =
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(local_10c + 4);
          overlapMerge(in_stack_fffffffffffffc30,(BamAlignment *)in_stack_fffffffffffffc28,
                       &in_stack_fffffffffffffc20->name,in_stack_fffffffffffffc18,
                       in_stack_fffffffffffffc10,
                       (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc08,
                       in_stack_fffffffffffffc40,(int *)in_stack_fffffffffffffc48,
                       (int *)in_stack_fffffffffffffc50,
                       (int *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                       in_stack_fffffffffffffc60);
        }
        while ((int)local_f8._0_4_ <= (int)local_f8._4_4_) {
          in_stack_fffffffffffffbf8 =
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_f8;
          in_stack_fffffffffffffc00 =
               (ShortDnaSequence *)CONCAT44((int)((ulong)in_stack_fffffffffffffc00 >> 0x20),1);
          noOverlapMergeBAM(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                            &in_stack_fffffffffffffc20->name,in_stack_fffffffffffffc18,
                            (int *)in_stack_fffffffffffffc10,(int *)in_stack_fffffffffffffc08,
                            in_stack_fffffffffffffc40,(int)in_stack_fffffffffffffc48);
        }
      }
      else {
        while ((int)local_f8._0_4_ < (int)local_f0._0_4_) {
          in_stack_fffffffffffffc08 = (string *)local_f8;
          in_stack_fffffffffffffc00 = (ShortDnaSequence *)local_104;
          in_stack_fffffffffffffbf8 =
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_10c;
          noOverlapMerge(in_stack_fffffffffffffc20,(BamAlignment *)in_stack_fffffffffffffc18,
                         in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                         (string *)in_stack_fffffffffffffc00,
                         (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffbf8,
                         (int *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc38,
                         in_stack_fffffffffffffc40);
        }
        while ((int)local_f8._0_4_ <= (int)local_f8._4_4_) {
          in_stack_fffffffffffffc18 = (string *)local_f8;
          in_stack_fffffffffffffc10 = (string *)local_104;
          in_stack_fffffffffffffc08 = (string *)(local_104 + 4);
          in_stack_fffffffffffffc00 = (ShortDnaSequence *)local_10c;
          in_stack_fffffffffffffbf8 =
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(local_10c + 4);
          overlapMerge(in_stack_fffffffffffffc30,(BamAlignment *)in_stack_fffffffffffffc28,
                       &in_stack_fffffffffffffc20->name,in_stack_fffffffffffffc18,
                       in_stack_fffffffffffffc10,
                       (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc08,
                       in_stack_fffffffffffffc40,(int *)in_stack_fffffffffffffc48,
                       (int *)in_stack_fffffffffffffc50,
                       (int *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                       in_stack_fffffffffffffc60);
        }
        while ((int)local_f8._0_4_ <= local_fc) {
          in_stack_fffffffffffffc08 = (string *)local_f8;
          in_stack_fffffffffffffc00 = (ShortDnaSequence *)local_104;
          in_stack_fffffffffffffbf8 =
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_10c;
          noOverlapMerge(in_stack_fffffffffffffc20,(BamAlignment *)in_stack_fffffffffffffc18,
                         in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                         (string *)in_stack_fffffffffffffc00,
                         (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffbf8,
                         (int *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc38,
                         in_stack_fffffffffffffc40);
        }
      }
    }
    else {
      while ((int)local_f0._0_4_ < (int)local_f8._0_4_) {
        in_stack_fffffffffffffbf8 =
             (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_f0;
        in_stack_fffffffffffffc00 =
             (ShortDnaSequence *)CONCAT44((int)((ulong)in_stack_fffffffffffffc00 >> 0x20),1);
        noOverlapMergeBAM(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                          &in_stack_fffffffffffffc20->name,in_stack_fffffffffffffc18,
                          (int *)in_stack_fffffffffffffc10,(int *)in_stack_fffffffffffffc08,
                          in_stack_fffffffffffffc40,(int)in_stack_fffffffffffffc48);
      }
      while ((int)local_f0._0_4_ <= local_fc) {
        in_stack_fffffffffffffc18 = (string *)local_f0;
        in_stack_fffffffffffffc10 = (string *)local_104;
        in_stack_fffffffffffffc08 = (string *)(local_104 + 4);
        in_stack_fffffffffffffc00 = (ShortDnaSequence *)local_10c;
        in_stack_fffffffffffffbf8 =
             (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(local_10c + 4);
        overlapMerge(in_stack_fffffffffffffc30,(BamAlignment *)in_stack_fffffffffffffc28,
                     &in_stack_fffffffffffffc20->name,in_stack_fffffffffffffc18,
                     in_stack_fffffffffffffc10,
                     (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc08,
                     in_stack_fffffffffffffc40,(int *)in_stack_fffffffffffffc48,
                     (int *)in_stack_fffffffffffffc50,
                     (int *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     in_stack_fffffffffffffc60);
      }
      while ((int)local_f0._0_4_ <= (int)local_f8._4_4_) {
        in_stack_fffffffffffffbf8 =
             (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_f0;
        in_stack_fffffffffffffc00 =
             (ShortDnaSequence *)CONCAT44((int)((ulong)in_stack_fffffffffffffc00 >> 0x20),1);
        noOverlapMergeBAM(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                          &in_stack_fffffffffffffc20->name,in_stack_fffffffffffffc18,
                          (int *)in_stack_fffffffffffffc10,(int *)in_stack_fffffffffffffc08,
                          in_stack_fffffffffffffc40,(int)in_stack_fffffffffffffc48);
      }
    }
  }
  else {
    while ((int)local_f0._0_4_ < (int)local_f8._0_4_) {
      in_stack_fffffffffffffbf8 =
           (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_f0;
      in_stack_fffffffffffffc00 =
           (ShortDnaSequence *)CONCAT44((int)((ulong)in_stack_fffffffffffffc00 >> 0x20),1);
      noOverlapMergeBAM(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                        &in_stack_fffffffffffffc20->name,in_stack_fffffffffffffc18,
                        (int *)in_stack_fffffffffffffc10,(int *)in_stack_fffffffffffffc08,
                        in_stack_fffffffffffffc40,(int)in_stack_fffffffffffffc48);
    }
    while ((int)local_f0._0_4_ <= (int)local_f8._4_4_) {
      in_stack_fffffffffffffc18 = (string *)local_f0;
      in_stack_fffffffffffffc10 = (string *)local_104;
      in_stack_fffffffffffffc08 = (string *)(local_104 + 4);
      in_stack_fffffffffffffc00 = (ShortDnaSequence *)local_10c;
      in_stack_fffffffffffffbf8 =
           (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(local_10c + 4);
      overlapMerge(in_stack_fffffffffffffc30,(BamAlignment *)in_stack_fffffffffffffc28,
                   &in_stack_fffffffffffffc20->name,in_stack_fffffffffffffc18,
                   in_stack_fffffffffffffc10,
                   (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc08,
                   in_stack_fffffffffffffc40,(int *)in_stack_fffffffffffffc48,
                   (int *)in_stack_fffffffffffffc50,
                   (int *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                   in_stack_fffffffffffffc60);
    }
    while ((int)local_f0._0_4_ <= local_fc) {
      in_stack_fffffffffffffc08 = (string *)local_f0;
      in_stack_fffffffffffffc00 = (ShortDnaSequence *)local_104;
      in_stack_fffffffffffffbf8 =
           (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_10c;
      noOverlapMerge(in_stack_fffffffffffffc20,(BamAlignment *)in_stack_fffffffffffffc18,
                     in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                     (string *)in_stack_fffffffffffffc00,
                     (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffbf8,
                     (int *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc38,
                     in_stack_fffffffffffffc40);
    }
  }
  local_110 = *(int *)(local_10 + 0xac) + 1;
  puVar3 = std::min<unsigned_int>(&in_RDI->start1,&local_110);
  in_RDI->start1 = *puVar3;
  local_114 = BamTools::BamAlignment::GetEndPosition(SUB81(local_10,0),false);
  psVar4 = (string *)std::max<unsigned_int>(&local_114,&in_RDI->end1);
  in_RDI->end1 = *(uint *)psVar4;
  in_RDI->single_end = true;
  createCigar(psVar4);
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
            ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
             in_stack_fffffffffffffc10,
             (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
             in_stack_fffffffffffffc08);
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~vector
            ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
             in_stack_fffffffffffffc10);
  iVar2 = phred_sum(in_stack_fffffffffffffc10,(char)((ulong)in_stack_fffffffffffffc08 >> 0x38));
  in_RDI->phred_sum1 = iVar2;
  std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0x291ec0);
  local_138 = local_99 + 1;
  local_140._M_current = (char *)std::__cxx11::string::begin();
  local_148 = std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffc00,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffbf8), bVar1) {
    pcVar5 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_140);
    local_149 = *pcVar5;
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc10,
               (value_type *)in_stack_fffffffffffffc08);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_140);
  }
  getCigar1Unrolled(in_RDI);
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffc50,
             (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc48);
  std::__cxx11::string::string(local_1e0,(string *)&stack0xffffffffffffff90);
  referenceString(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                  in_stack_ffffffffffffff80,(string *)in_stack_ffffffffffffff78,
                  in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_1e0);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc10);
  if ((in_RDI->strand1 & 1U) == 0) {
    std::__cxx11::string::string(local_268,local_38);
    complement(in_stack_fffffffffffffc48);
    ShortDnaSequence::ShortDnaSequence
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    ShortDnaSequence::operator=(in_stack_fffffffffffffc00,local_18);
    ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffffc00);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_268);
    p_Var6 = std::
             get<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                         *)0x2920b4);
    std::__cxx11::string::string(local_2a8,(string *)p_Var6);
    complement(in_stack_fffffffffffffc48);
    psVar4 = &local_288;
    std::__cxx11::string::operator=((string *)&in_RDI->reference_seq1,(string *)psVar4);
    std::__cxx11::string::~string((string *)psVar4);
    std::__cxx11::string::~string(local_2a8);
    p_Var7 = std::
             get<1ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                         *)0x292122);
    std::__cxx11::string::string(local_2e8,(string *)p_Var7);
    complement(psVar4);
    this_00 = local_2c8;
    std::__cxx11::string::operator=((string *)&in_RDI->alignSequence1,this_00);
    std::__cxx11::string::~string(this_00);
    std::__cxx11::string::~string(local_2e8);
    std::get<2ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                *)0x292190);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)this_02,
               (vector<int,_std::allocator<int>_> *)this_01);
  }
  else {
    ShortDnaSequence::ShortDnaSequence
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    ShortDnaSequence::operator=(in_stack_fffffffffffffc00,local_18);
    ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffffc00);
    p_Var6 = std::
             get<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                         *)0x2922f9);
    std::__cxx11::string::operator=((string *)&in_RDI->reference_seq1,(string *)p_Var6);
    p_Var7 = std::
             get<1ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                         *)0x29231f);
    std::__cxx11::string::operator=((string *)&in_RDI->alignSequence1,(string *)p_Var7);
    std::get<2ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                *)0x292345);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)this_02,
               (vector<int,_std::allocator<int>_> *)this_01);
  }
  sVar8 = ShortDnaSequence::size((ShortDnaSequence *)0x292371);
  in_RDI->length_incl_deletions1 = (int)sVar8;
  sVar8 = ShortDnaSequence::size((ShortDnaSequence *)0x292391);
  in_RDI->length_incl_longdeletions1 = (int)sVar8;
  coveredPositions(this_01);
  std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::operator=
            ((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
             in_stack_fffffffffffffc10,
             (vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
             in_stack_fffffffffffffc08);
  std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::~vector
            ((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
             in_stack_fffffffffffffc10);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
            *)0x2923ed);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc10);
  std::__cxx11::string::~string((string *)(local_99 + 1));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void AlignmentRecord::getMergedDnaSequence(const BamTools::BamAlignment& alignment,string & mainReference){
        std::string dna = "";
        std::string qualities = "";
        std::string nucigar = "";
        std::vector<char> cigar_temp_unrolled;
        //vector of CigarOp
        for (const auto& it : alignment.CigarData) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                cigar_temp_unrolled.push_back(it.Type);
            }
        }
        //get starting position and ending position according to ref position, paying attention to clipped bases
        int offset_f1 = computeOffset(this->cigar1_unrolled);
        int offset_f2 = computeOffset(cigar_temp_unrolled);
        int offset_b1 = computeRevOffset(this->cigar1_unrolled);
        int offset_b2 = computeRevOffset(cigar_temp_unrolled);

        //updated ref position including clips
        int ref_s_pos1 = this->start1-offset_f1;
        int ref_e_pos1 = this->end1+offset_b1;
        int ref_s_pos2 = alignment.Position+1-offset_f2;
        int ref_e_pos2 = alignment.GetEndPosition()+offset_b2;
        //position in query sequences // phred scores
        int q_pos1 = 0;
        int q_pos2 = 0;
        //position in unrolled cigar vectors
        int c_pos1 = 0;
        int c_pos2 = 0;
        //4 cases of different overlaps
        //------------
        //     ------------
        if(ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
            while(ref_s_pos1<ref_s_pos2){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,1);
            }
            while(ref_s_pos1<=ref_e_pos1){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1);
            }
            while(ref_s_pos1<=ref_e_pos2){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos1);
            }
        }//------------------------------
            //           ----------
         else if (ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2){
            while(ref_s_pos1<ref_s_pos2){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,1);
            }
            while(ref_s_pos1<=ref_e_pos2){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1);
            }
            while(ref_s_pos1<=ref_e_pos1){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,1);
            }
            //         ----------
            //--------------------------
        } else if (ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
            while(ref_s_pos2<ref_s_pos1){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos1){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos2){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos2);
            }
            //           --------------------
            //---------------------
        } else {
            assert(ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2);
            while(ref_s_pos2<ref_s_pos1){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos2){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos1){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos2,1);
            }
        }
        this->start1 = std::min(this->start1,(unsigned int)alignment.Position+1);
        this->end1=std::max((unsigned int)alignment.GetEndPosition(),this->end1);
        this->single_end= true;
        this->cigar1 = createCigar(nucigar);

        this->phred_sum1=phred_sum(qualities);

        this->cigar1_unrolled.clear();
        for (char i : nucigar){
            this->cigar1_unrolled.push_back(i);
        }

        //NoMe Additions
        std::tuple<string,string,vector<int>> ref = referenceString(this->getCigar1Unrolled(),alignment.Position,dna,qualities,mainReference);
        if(!this->strand1){
           this->sequence1 = ShortDnaSequence(complement(dna), qualities);
           this->reference_seq1=complement(std::get<0>(ref));
           this->alignSequence1=complement(std::get<1>(ref));
            this->qualityList1 = std::get<2>(ref);
        }else{
           this->sequence1=ShortDnaSequence(dna,qualities);
           this->reference_seq1=std::get<0>(ref);
           this->alignSequence1=std::get<1>(ref);
            this->qualityList1 = std::get<2>(ref);
        }
        //fill out thr frs ffs thing here

        this->length_incl_deletions1 = this->sequence1.size();
        this->length_incl_longdeletions1 = this->sequence1.size();
        //End NoMe Additions
        //this->strandInfo = this->determineStrand(this->alignSequence1,this->reference_seq1);
        this->cov_pos = this->coveredPositions();
}